

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O0

string * helics::queryFederateSubscriptions_abi_cxx11_(Federate *fed,string_view fedName)

{
  size_type sVar1;
  char *in_RSI;
  string *in_RDI;
  Federate *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  undefined1 in_stack_00000040 [16];
  HelicsSequencingModes in_stack_00000060;
  string *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *__s;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  __s = in_RSI;
  this = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_ffffffffffffff48);
  Federate::query_abi_cxx11_
            (in_stack_00000028,(string_view)in_stack_00000040,(string_view)in_stack_00000030,
             in_stack_00000060);
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  if ((2 < sVar1) &&
     (sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         __s,(size_type)in_RDI), sVar1 == 0xffffffffffffffff)) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_RSI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff40);
    Federate::query_abi_cxx11_
              (in_stack_00000028,(string_view)in_stack_00000040,(string_view)in_stack_00000030,
               in_stack_00000060);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(in_stack_ffffffffffffff40);
  }
  return in_RDI;
}

Assistant:

std::string queryFederateSubscriptions(helics::Federate* fed, std::string_view fedName)
{
    auto res = fed->query(fedName, "subscriptions", HELICS_SEQUENCING_MODE_ORDERED);
    if (res.size() > 2 && res.find("error") == std::string::npos) {
        res = fed->query("gid_to_name", res);
    }
    return res;
}